

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

int Aig_ManCountMergeRegs(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  Aig_ManIncrementTravId(p);
  uVar1 = p->nRegs;
  uVar5 = p->nObjs[3] - uVar1;
  pVVar3 = p->vCos;
  iVar2 = pVVar3->nSize;
  uVar7 = 0;
  uVar6 = 0;
  uVar8 = 0;
  if ((int)uVar5 < iVar2) {
    uVar9 = (ulong)uVar5;
    uVar8 = 0;
    uVar6 = 0;
    uVar7 = 0;
    do {
      if ((int)uVar5 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar4 = *(ulong *)((long)pVVar3->pArray[uVar9] + 8);
      uVar10 = uVar4 & 0xfffffffffffffffe;
      if ((*(uint *)(uVar10 + 0x18) & 7) == 1) {
        if ((uVar4 & 1) == 0) {
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        else {
          uVar6 = (ulong)((int)uVar6 + 1);
        }
      }
      if (*(int *)(uVar10 + 0x20) != p->nTravIds) {
        *(int *)(uVar10 + 0x20) = p->nTravIds;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < iVar2);
  }
  printf("Regs = %d. Fanins = %d. Const0 = %d. Const1 = %d.\n",(ulong)uVar1,uVar7,uVar6,uVar8);
  return 0;
}

Assistant:

int Aig_ManCountMergeRegs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin;
    int i, Counter = 0, Const0 = 0, Const1 = 0;
    Aig_ManIncrementTravId( p );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1(pFanin) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                Const0++;
            else
                Const1++;
        }
        if ( Aig_ObjIsTravIdCurrent(p, pFanin) )
            continue;
        Aig_ObjSetTravIdCurrent(p, pFanin);
        Counter++;
    }
    printf( "Regs = %d. Fanins = %d. Const0 = %d. Const1 = %d.\n", 
        Aig_ManRegNum(p), Counter, Const0, Const1 );
    return 0;
}